

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandleRandomCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  ulong uVar2;
  undefined1 *puVar3;
  long lVar4;
  int iVar5;
  uint __seed;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  char local_dd;
  uint local_dc;
  string local_d8;
  cmCommand *local_b0;
  double local_a8;
  double dStack_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  string local_78;
  char acStack_58 [40];
  
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar9 < 6) && ((0x2bUL >> (uVar9 & 0x3f) & 1) != 0)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"sub-command RANDOM requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  builtin_strncpy(acStack_58,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  local_78.field_2._M_local_buf[0] = 'j';
  local_78.field_2._M_local_buf[1] = 'k';
  local_78.field_2._M_local_buf[2] = 'l';
  local_78.field_2._M_local_buf[3] = 'z';
  local_78.field_2._M_local_buf[4] = 'x';
  local_78.field_2._M_local_buf[5] = 'c';
  local_78.field_2._M_local_buf[6] = 'v';
  local_78.field_2._M_local_buf[7] = 'b';
  local_78.field_2._M_local_buf[8] = 'n';
  local_78.field_2._M_local_buf[9] = 'm';
  local_78.field_2._M_local_buf[10] = 'Q';
  local_78.field_2._M_local_buf[0xb] = 'W';
  local_78.field_2._M_local_buf[0xc] = 'E';
  local_78.field_2._M_local_buf[0xd] = 'R';
  local_78.field_2._M_local_buf[0xe] = 'T';
  local_78.field_2._M_local_buf[0xf] = 'Y';
  local_78._M_dataplus._M_p = (pointer)0x6975797472657771;
  local_78._M_string_length._0_1_ = 'o';
  local_78._M_string_length._1_1_ = 'p';
  local_78._M_string_length._2_1_ = 'a';
  local_78._M_string_length._3_1_ = 's';
  local_78._M_string_length._4_1_ = 'd';
  local_78._M_string_length._5_1_ = 'f';
  local_78._M_string_length._6_1_ = 'g';
  local_78._M_string_length._7_1_ = 'h';
  local_98 = &local_88;
  local_90 = 0;
  local_88 = 0;
  iVar8 = 5;
  uVar2 = (ulong)local_a8 >> 0x20;
  local_a8 = (double)(uVar2 << 0x20);
  local_b0 = &this->super_cmCommand;
  if (uVar9 < 4) {
    local_dc = 0;
LAB_0036adc8:
    strlen((char *)&local_78);
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)&local_78);
    if (local_90 != 0) goto LAB_0036adf7;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"sub-command RANDOM invoked with bad alphabet.","");
    cmCommand::SetError(local_b0,&local_d8);
  }
  else {
    local_a8 = (double)(uVar2 << 0x20);
    local_dc = 0;
    if (uVar9 - 2 < 2) goto LAB_0036adc8;
    uVar7 = 1;
    local_a8 = (double)(uVar2 << 0x20);
    local_dc = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar7));
      if (iVar5 == 0) {
        uVar7 = uVar7 + 1;
        iVar8 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar7));
        if (iVar5 == 0) {
          uVar7 = uVar7 + 1;
          std::__cxx11::string::_M_assign((string *)&local_98);
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7));
          if (iVar5 == 0) {
            uVar7 = uVar7 + 1;
            local_dc = atoi((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p);
            local_a8 = (double)CONCAT44(local_a8._4_4_,
                                        (int)CONCAT71((uint7)(uint3)(local_dc >> 8),1));
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar9 - 2);
    if (local_90 == 0) goto LAB_0036adc8;
LAB_0036adf7:
    lVar4 = local_90;
    if (0 < iVar8) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      if (((~HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::seeded | SUB81(local_a8,0)) & 1) != 0) {
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::seeded = 1;
        __seed = local_dc;
        if (((ulong)local_a8 & 1) == 0) {
          __seed = cmSystemTools::RandomSeed();
        }
        srand(__seed);
      }
      puVar3 = local_98;
      auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar10._0_8_ = lVar4;
      auVar10._12_4_ = 0x45300000;
      dStack_a0 = auVar10._8_8_ - 1.9342813113834067e+25;
      local_a8 = dStack_a0 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
      do {
        iVar5 = rand();
        if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_d8,
                     (iterator)local_d8._M_string_length,
                     puVar3 + (int)((double)iVar5 * local_a8 * 4.656612873077393e-10));
        }
        else {
          *(undefined1 *)local_d8._M_string_length =
               puVar3[(int)((double)iVar5 * local_a8 * 4.656612873077393e-10)];
          local_d8._M_string_length = local_d8._M_string_length + 1;
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      local_dd = '\0';
      if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  ((vector<char,_std::allocator<char>_> *)&local_d8,
                   (iterator)local_d8._M_string_length,&local_dd);
      }
      else {
        *(char *)local_d8._M_string_length = '\0';
        local_d8._M_string_length = local_d8._M_string_length + 1;
      }
      cmMakefile::AddDefinition(local_b0->Makefile,pbVar1 + -1,local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_d8._M_dataplus._M_p,
                        local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
      }
      bVar6 = true;
      goto LAB_0036af9d;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"sub-command RANDOM invoked with bad length.","");
    cmCommand::SetError(local_b0,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  bVar6 = false;
LAB_0036af9d:
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return bVar6;
}

Assistant:

bool cmStringCommand::HandleRandomCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    this->SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    this->SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    this->SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args[args.size() - 1];

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  int cc;
  for (cc = 0; cc < length; cc++) {
    int idx = (int)(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  this->Makefile->AddDefinition(variableName, &*result.begin());
  return true;
}